

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ClearJoins(Clipper *this)

{
  size_type sVar1;
  reference ppJVar2;
  ulong local_18;
  size_type i;
  Clipper *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::size
                      (&this->m_Joins);
    if (sVar1 <= local_18) break;
    ppJVar2 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::operator[]
                        (&this->m_Joins,local_18);
    if (*ppJVar2 != (value_type)0x0) {
      operator_delete(*ppJVar2,0x50);
    }
    local_18 = local_18 + 1;
  }
  std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::resize
            (&this->m_Joins,0);
  return;
}

Assistant:

void Clipper::ClearJoins()
{
  for (JoinList::size_type i = 0; i < m_Joins.size(); i++)
    delete m_Joins[i];
  m_Joins.resize(0);
}